

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

array_n<bool,_2,_std::allocator<bool>_> * __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::operator=
          (array_n<bool,_2,_std::allocator<bool>_> *this,
          array_n<bool,_2,_std::allocator<bool>_> *obj)

{
  int local_3c;
  undefined1 local_38 [4];
  int i;
  array_n<bool,_2,_std::allocator<bool>_> copy;
  array_n<bool,_2,_std::allocator<bool>_> *obj_local;
  array_n<bool,_2,_std::allocator<bool>_> *this_local;
  
  copy.last = (pointer)obj;
  array_n((array_n<bool,_2,_std::allocator<bool>_> *)local_38,obj);
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    std::swap<unsigned_int>(this->_dims + local_3c,copy._dims + (long)local_3c + -2);
  }
  std::swap<bool*>(&this->first,(bool **)copy._dims);
  std::swap<bool*>(&this->last,&copy.first);
  std::swap<bool*>(&this->_array,(bool **)local_38);
  ~array_n((array_n<bool,_2,_std::allocator<bool>_> *)local_38);
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }